

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.c
# Opt level: O2

size_t tga_estimate_size(image_data image,int expand)

{
  size_t sVar1;
  
  sVar1 = 0;
  if (((0xfd < (byte)(image.type - 3)) && (image.palette.data.ptr != (uchar *)0x0)) &&
     (image.palette.type == '\x01')) {
    if (expand != 0) {
      return (4 - (ulong)(image.alpha_pixels == 0)) * image.pixels.size + 0x12;
    }
    sVar1 = image.pixels.size + 0x312;
  }
  return sVar1;
}

Assistant:

size_t tga_estimate_size(struct image_data image, int expand)
{
	if (!is_supported(image)) {
		return 0;
	}
	if (expand) {
		return TGA_HEADER_SIZE + image.pixels.size * ( image.alpha_pixels ? 4 : 3 );
	} else {
		return TGA_HEADER_SIZE + image.pixels.size + 768;
	}
}